

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

void __thiscall
adios2::query::QueryComposite::BlockIndexEvaluate
          (QueryComposite *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  Relation RVar1;
  BlockHit *pBVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  pointer pBVar7;
  pointer pBVar8;
  BlockHit *cpy;
  pointer pBVar9;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> currBlocks;
  BlockHit b;
  int local_bc;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_b8;
  QueryComposite *local_a0;
  pointer local_98;
  IO *local_90;
  Engine *local_88;
  pointer local_80;
  BlockHit *local_78;
  BlockHit local_70;
  BlockHit local_50;
  
  local_80 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98 != local_80) {
    local_bc = 0;
    local_a0 = this;
    local_90 = io;
    local_88 = reader;
    do {
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_start = (BlockHit *)0x0;
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_finish = (BlockHit *)0x0;
      local_b8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(*local_80)->_vptr_QueryBase[4])(*local_80,local_90,local_88,&local_b8);
      if (local_bc == 0) {
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::operator=
                  (touchedBlocks,&local_b8);
      }
      else {
        RVar1 = local_a0->m_Relation;
        local_78 = local_b8.
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_b8.
            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          if (RVar1 == AND) {
            pBVar8 = (touchedBlocks->
                     super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pBVar7 = (touchedBlocks->
                     super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pBVar9 = pBVar8;
            if (pBVar7 != pBVar8) {
              do {
                std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::~vector(&pBVar9->m_Regions);
                pBVar9 = pBVar9 + 1;
              } while (pBVar9 != pBVar7);
              (touchedBlocks->
              super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>)
              ._M_impl.super__Vector_impl_data._M_finish = pBVar8;
            }
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                      (&local_b8);
            return;
          }
        }
        else if (RVar1 == AND) {
          lVar5 = (long)(touchedBlocks->
                        super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(touchedBlocks->
                        super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                        )._M_impl.super__Vector_impl_data._M_start;
          if (lVar5 != 0) {
            lVar5 = lVar5 >> 5;
            cpy = local_b8.
                  super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            pBVar2 = local_b8.
                     super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
LAB_00623782:
            do {
              if (cpy == pBVar2) {
                std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
                _M_erase(touchedBlocks,
                         (touchedBlocks->
                         super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar5 + -1);
              }
              else {
                BlockHit::BlockHit(&local_70,cpy);
                bVar4 = BlockHit::applyIntersection
                                  ((touchedBlocks->
                                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar5,&local_70);
                std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::~vector(&local_70.m_Regions);
                if (!bVar4) {
                  cpy = cpy + 1;
                  goto LAB_00623782;
                }
              }
              lVar5 = lVar5 + -1;
              cpy = local_b8.
                    super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              pBVar2 = local_b8.
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            } while (lVar5 != 0);
          }
        }
        else {
          pBVar8 = local_b8.
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (RVar1 == OR) {
            do {
              BlockHit::BlockHit(&local_70,pBVar8);
              pBVar7 = (touchedBlocks->
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pBVar9 = (touchedBlocks->
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (pBVar7 == pBVar9) {
LAB_00623725:
                std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
                push_back(touchedBlocks,&local_70);
              }
              else {
                bVar3 = 0;
                do {
                  bVar6 = bVar3;
                  BlockHit::BlockHit(&local_50,pBVar7);
                  bVar4 = BlockHit::applyExtension(&local_50,&local_70);
                  std::
                  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::~vector(&local_50.m_Regions);
                  pBVar7 = pBVar7 + 1;
                  bVar3 = bVar6 | bVar4;
                } while (pBVar7 != pBVar9);
                if (bVar6 == 0 && !bVar4) goto LAB_00623725;
              }
              std::
              vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::~vector(&local_70.m_Regions);
              pBVar8 = pBVar8 + 1;
            } while (pBVar8 != local_78);
          }
        }
      }
      local_bc = local_bc + 1;
      std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                (&local_b8);
      local_80 = local_80 + 1;
    } while (local_80 != local_98);
  }
  return;
}

Assistant:

void QueryComposite::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                        // std::vector<Box<Dims>> &touchedBlocks)
                                        std::vector<BlockHit> &touchedBlocks)
{
    auto lf_ApplyAND = [&](std::vector<BlockHit> &touched,
                           const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
        {
            touched.clear();
            return;
        }

        for (auto i = touched.size(); i >= 1; i--)
        {
            bool intersects = false;
            for (auto b : curr)
            {
                if (touched[i].applyIntersection(b))
                {
                    intersects = true;
                    break;
                }
            }
            if (!intersects)
                touched.erase(touched.begin() + i - 1);
        }
    }; // lf_ApplyAND

    auto lf_ApplyOR = [&](std::vector<BlockHit> &touched,
                          const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
            return;

        for (auto b : curr)
        {
            bool duplicated = false;
            for (auto box : touched)
            {
                if (box.applyExtension(b))
                {
                    duplicated = true;
                    continue;
                }
            }
            if (!duplicated)
                touched.push_back(b);
        }
    }; // lf_ApplyOR

    if (m_Nodes.size() == 0)
        return;

    int counter = 0;
    for (auto node : m_Nodes)
    {
        counter++;
        std::vector<BlockHit> currBlocks;
        node->BlockIndexEvaluate(io, reader, currBlocks);
        if (counter == 1)
        {
            touchedBlocks = currBlocks;
            continue;
        }

        if (currBlocks.size() == 0)
        {
            if (adios2::query::Relation::AND == m_Relation)
            {
                touchedBlocks.clear();
                break;
            }
            else
                continue;
        }

        if (adios2::query::Relation::AND == m_Relation)
            lf_ApplyAND(touchedBlocks, currBlocks);
        else if (adios2::query::Relation::OR == m_Relation)
            lf_ApplyOR(touchedBlocks, currBlocks);
    }
}